

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ManPrepare(Mpm_Man_t *p)

{
  int iVar1;
  Mig_Obj_t *pMVar2;
  int i;
  int iVar3;
  uint i_00;
  Mig_Man_t *p_00;
  Mig_Fan_t *pMVar4;
  
  iVar3 = 0;
  do {
    p_00 = p->pMig;
    if ((p_00->vCis).nSize <= iVar3) {
LAB_0037d920:
      p_00->iPage = 0;
      iVar3 = 0;
      while( true ) {
        if ((p_00->vPages).nSize <= iVar3) {
          return;
        }
        pMVar2 = (Mig_Obj_t *)Vec_PtrEntry(&p_00->vPages,iVar3);
        p->pMig->pPage = pMVar2;
        if (pMVar2 == (Mig_Obj_t *)0x0) break;
        for (pMVar4 = pMVar2->pFans + 3; (uint)*pMVar4 >> 1 < 0x7fffffff; pMVar4 = pMVar4 + 4) {
          if (((uint)pMVar4[-2] < 0xfffffffe) ||
             (((uint)pMVar4[-1] < 0xfffffffe && (0xfffffffd < (uint)pMVar4[-3])))) {
            i_00 = (uint)*pMVar4 >> 1;
            iVar3 = Vec_IntEntry((Vec_Int_t *)
                                 (*(long *)((long)pMVar4 + (-0x1c - (ulong)((i_00 & 0xfff) << 4))) +
                                 0x88),i_00);
            Vec_IntWriteEntry(&p->vEstRefs,(uint)*pMVar4 >> 1,iVar3 * 100);
          }
        }
        p_00 = p->pMig;
        iVar3 = p_00->iPage + 1;
        p_00->iPage = iVar3;
      }
      return;
    }
    iVar1 = Vec_IntEntry(&p_00->vCis,iVar3);
    pMVar2 = Mig_ManObj(p_00,iVar1);
    if (pMVar2 == (Mig_Obj_t *)0x0) {
      p_00 = p->pMig;
      goto LAB_0037d920;
    }
    iVar1 = Mpm_CutCreateUnit(p,(uint)pMVar2->pFans[3] >> 1);
    Mpm_ObjSetCutBest(p,pMVar2,iVar1);
    Mpm_ObjSetCutList(p,pMVar2,iVar1);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Mpm_ManPrepare( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    int i, hCut;
    Mig_ManForEachCi( p->pMig, pObj, i )
    {
        hCut = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
        Mpm_ObjSetCutBest( p, pObj, hCut );
        Mpm_ObjSetCutList( p, pObj, hCut );
    }
    Mig_ManForEachCand( p->pMig, pObj )
        Mpm_ObjSetEstRef( p, pObj, MPM_UNIT_REFS * Mig_ObjRefNum(pObj) );
}